

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32_t num,string_view s,uint8_t *ptr)

{
  int iVar1;
  size_t __n;
  uint8_t *puVar2;
  uint uVar3;
  
  __n = s._M_len;
  if ((long)__n < 0x80) {
    puVar2 = this->end_;
    iVar1 = TagSize(num * 8);
    if ((long)__n <= (long)(puVar2 + ~(ulong)(ptr + iVar1) + 0x10)) {
      puVar2 = ptr + 2;
      for (uVar3 = num * 8 | 2; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
        puVar2[-2] = (byte)uVar3 | 0x80;
        puVar2 = puVar2 + 1;
      }
      puVar2[-2] = (byte)uVar3;
      puVar2[-1] = (uint8_t)s._M_len;
      memcpy(puVar2,s._M_str,__n);
      return puVar2 + __n;
    }
  }
  puVar2 = WriteStringMaybeAliasedOutline(this,num,s,ptr);
  return puVar2;
}

Assistant:

uint8_t* WriteStringMaybeAliased(uint32_t num, absl::string_view s,
                                   uint8_t* ptr) {
    std::ptrdiff_t size = s.size();
    if (ABSL_PREDICT_FALSE(size >= 128 ||
                           end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8_t>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }